

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O0

void decompTest(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,int w,int h,int pf,
               char *basename,int subsamp,int flags)

{
  char *pcVar1;
  tjscalingfactor *sf;
  int n;
  int i;
  int *in_stack_ffffffffffffff98;
  
  tjGetScalingFactors(in_stack_ffffffffffffff98);
  pcVar1 = tjGetErrorStr();
  printf("TurboJPEG ERROR:\n%s\n",pcVar1);
  exitStatus = -1;
  return;
}

Assistant:

static void decompTest(tjhandle handle, unsigned char *jpegBuf,
                       unsigned long jpegSize, int w, int h, int pf,
                       char *basename, int subsamp, int flags)
{
  int i, n = 0;
  tjscalingfactor *sf = tjGetScalingFactors(&n);

  if (!sf || !n) THROW_TJ();

  for (i = 0; i < n; i++) {
    if (subsamp == TJSAMP_444 || subsamp == TJSAMP_GRAY ||
        (subsamp == TJSAMP_411 && sf[i].num == 1 &&
         (sf[i].denom == 2 || sf[i].denom == 1)) ||
        (subsamp != TJSAMP_411 && sf[i].num == 1 &&
         (sf[i].denom == 4 || sf[i].denom == 2 || sf[i].denom == 1)))
      _decompTest(handle, jpegBuf, jpegSize, w, h, pf, basename, subsamp,
                  flags, sf[i]);
  }

bailout:
  return;
}